

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

SpatialSplit * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
parallel_spatial_find
          (SpatialSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize)

{
  Vec3fa *pVVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  char cVar4;
  long lVar5;
  runtime_error *this_00;
  vuint4 *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar16;
  float fVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar18;
  SpatialBinMapping<16UL> mapping;
  task_group_context context;
  SpatialBinner binner;
  task_group_context *in_stack_ffffffffffffee40;
  anon_class_16_2_ed117de8_conflict6 local_1181;
  HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
  *local_1170;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_1168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1160;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1150;
  uint local_1140;
  uint uStack_113c;
  uint uStack_1138;
  uint uStack_1134;
  undefined1 local_1130 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1120;
  undefined8 local_1110;
  task_group_context local_1100;
  SpatialBinInfo<16UL,_embree::PrimRef> local_1080;
  SpatialBinInfo<16UL,_embree::PrimRef> local_880;
  
  pvVar6 = local_1080.numEnd;
  for (lVar5 = 0x50; lVar5 != 0x650; lVar5 = lVar5 + 0x60) {
    pcVar2 = local_1100.padding + lVar5 + 0x28;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = -0x80;
    pcVar2[3] = '\x7f';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = -0x80;
    pcVar2[7] = '\x7f';
    pcVar2 = local_1100.padding + lVar5 + 0x30;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = -0x80;
    pcVar2[3] = '\x7f';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = -0x80;
    pcVar2[7] = '\x7f';
    *(undefined8 *)((long)&local_1080.bounds[0][0].lower.field_0 + lVar5) = 0xff800000ff800000;
    *(undefined8 *)((long)&local_1080.bounds[0][0].lower.field_0 + lVar5 + 8) = 0xff800000ff800000;
    pcVar2 = local_1100.padding + lVar5 + 8;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = -0x80;
    pcVar2[3] = '\x7f';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = -0x80;
    pcVar2[7] = '\x7f';
    pcVar2 = local_1100.padding + lVar5 + 0x10;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = -0x80;
    pcVar2[3] = '\x7f';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = -0x80;
    pcVar2[7] = '\x7f';
    pcVar2 = local_1100.padding + lVar5 + 0x18;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = -0x80;
    pcVar2[3] = -1;
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = -0x80;
    pcVar2[7] = -1;
    pcVar2 = local_1100.padding + lVar5 + 0x20;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = -0x80;
    pcVar2[3] = -1;
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = -0x80;
    pcVar2[7] = -1;
    pcVar2 = local_1100.padding + lVar5 + -0x18;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = -0x80;
    pcVar2[3] = '\x7f';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = -0x80;
    pcVar2[7] = '\x7f';
    pcVar2 = local_1100.padding + lVar5 + -0x10;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = -0x80;
    pcVar2[3] = '\x7f';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = -0x80;
    pcVar2[7] = '\x7f';
    pcVar2 = local_1100.padding + lVar5 + -8;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = -0x80;
    pcVar2[3] = -1;
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = -0x80;
    pcVar2[7] = -1;
    pcVar2 = local_1100.padding + lVar5;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = -0x80;
    pcVar2[3] = -1;
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = -0x80;
    pcVar2[7] = -1;
    (pvVar6->field_0).v[0] = 0;
    (pvVar6->field_0).v[1] = 0;
    pvVar6[-0x10].field_0.v[0] = 0;
    pvVar6[-0x10].field_0.v[1] = 0;
    pvVar6 = pvVar6 + 1;
  }
  local_1150.v[0] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[0];
  local_1150.v[1] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[1];
  local_1150.v[2] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[2];
  local_1150.v[3] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[3];
  pVVar1 = &(set->super_CentGeomBBox3fa).geomBounds.upper;
  fVar9 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[2];
  fVar10 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[3];
  auVar14._0_8_ =
       *(ulong *)&(set->super_CentGeomBBox3fa).geomBounds.lower.field_0 & 0x7fffffff7fffffff;
  auVar14._8_4_ = ABS(local_1150.v[2]);
  auVar14._12_4_ = ABS(local_1150.v[3]);
  auVar11._0_8_ = *(ulong *)&pVVar1->field_0 & 0x7fffffff7fffffff;
  auVar11._8_4_ = ABS(fVar9);
  auVar11._12_4_ = ABS(fVar10);
  auVar15 = maxps(auVar14,auVar11);
  fVar13 = auVar15._0_4_ * 1.5258789e-05;
  fVar16 = auVar15._4_4_ * 1.5258789e-05;
  auVar12._4_4_ = fVar16;
  auVar12._0_4_ = fVar13;
  fVar17 = auVar15._8_4_ * 1.5258789e-05;
  fVar18 = auVar15._12_4_ * 1.5258789e-05;
  fVar7 = (pVVar1->field_0).m128[0] - local_1150.v[0];
  fVar8 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[1] - local_1150.v[1];
  fVar9 = fVar9 - local_1150.v[2];
  fVar10 = fVar10 - local_1150.v[3];
  auVar12._8_4_ = fVar17;
  auVar12._12_4_ = fVar18;
  auVar15._4_4_ = fVar8;
  auVar15._0_4_ = fVar7;
  auVar15._8_4_ = fVar9;
  auVar15._12_4_ = fVar10;
  auVar15 = maxps(auVar12,auVar15);
  auVar15 = divps(_DAT_01f46b90,auVar15);
  local_1140 = -(uint)(fVar13 < fVar7) & auVar15._0_4_;
  uStack_113c = -(uint)(fVar16 < fVar8) & auVar15._4_4_;
  uStack_1138 = -(uint)(fVar17 < fVar9) & auVar15._8_4_;
  uStack_1134 = -(uint)(fVar18 < fVar10) & auVar15._12_4_;
  local_1168 = &local_1150;
  auVar3._4_4_ = uStack_113c;
  auVar3._0_4_ = local_1140;
  auVar3._8_4_ = uStack_1138;
  auVar3._12_4_ = uStack_1134;
  local_1130 = divps(_DAT_01f46a60,auVar3);
  local_1181.func._1_4_ =
       (undefined4)(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  local_1181._5_4_ =
       *(undefined4 *)
        ((long)&(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin + 4);
  local_1181.reduction._1_4_ =
       (undefined4)(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  unique0x10000ebe = local_1181._5_4_;
  local_1170 = this;
  tbb::detail::d1::task_group_context::task_group_context
            (&local_1100,(context_traits)0x4,CUSTOM_CTX);
  local_1120._0_8_ = CONCAT44(local_1181._5_4_,local_1181.reduction._1_4_);
  local_1120._8_8_ = CONCAT44(stack0xffffffffffffee8c,local_1181.func._1_4_);
  local_1110 = 0x400;
  local_1160._0_8_ = &local_1181;
  local_1160._8_8_ = &local_1170;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>,embree::parallel_reduce<unsigned_long,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::range<unsigned_long>const&)_1_,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::sse2::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_>
            (&local_880,(d1 *)&local_1120.field_1,(blocked_range<unsigned_long> *)&local_1080,
             (SpatialBinInfo<16UL,_embree::PrimRef> *)&local_1160.field_1,
             (anon_class_16_2_ed117de8_conflict6 *)local_1160._0_8_,
             (anon_class_1_0_00000001 *)&local_1100,in_stack_ffffffffffffee40);
  cVar4 = tbb::detail::r1::is_group_execution_cancelled(&local_1100);
  if (cVar4 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&local_1100);
    SpatialBinInfo<16UL,_embree::PrimRef>::operator=(&local_1080,&local_880);
    SpatialBinInfo<16UL,_embree::PrimRef>::best
              (__return_storage_ptr__,&local_1080,(SpatialBinMapping<16UL> *)&local_1150,
               logBlockSize);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

parallel_spatial_find(const PrimInfoExtRange& set, const size_t logBlockSize)
        {
          SpatialBinner binner(empty);
          const SpatialBinMapping<SPATIAL_BINS> mapping(set);
          const SpatialBinMapping<SPATIAL_BINS>& _mapping = mapping; // CLANG 3.4 parser bug workaround
          binner = parallel_reduce(set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,binner,
                                   [&] (const range<size_t>& r) -> SpatialBinner { 
                                     SpatialBinner binner(empty); 
                                     binner.bin2(splitterFactory,prims0,r.begin(),r.end(),_mapping);
                                     return binner; },
                                   [&] (const SpatialBinner& b0, const SpatialBinner& b1) -> SpatialBinner { return SpatialBinner::reduce(b0,b1); });
          /* todo: best spatial split not exceeding the extended range does not provide any benefit ?*/
          return binner.best(mapping,logBlockSize); //,set.ext_size());
        }